

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

int check_response_cache(CManager_conflict cm,stone_type stone,action_class stage,event_item *event)

{
  int iVar1;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  int i;
  int local_2c;
  
  local_2c = 0;
  do {
    if (*(int *)(in_RSI + 0x28) <= local_2c) {
      return -1;
    }
    if (*(long *)(*(long *)(in_RSI + 0x30) + (long)local_2c * 0x30) == *(long *)(in_RCX + 0x30)) {
      if (((((*(int *)(*(long *)(in_RSI + 0x30) + (long)local_2c * 0x30 + 0xc) != 0) ||
            (in_EDX == *(int *)(*(long *)(in_RSI + 0x30) + (long)local_2c * 0x30 + 8))) &&
           (iVar1 = compatible_stages(in_EDX,*(int *)(*(long *)(in_RSI + 0x30) +
                                                      (long)local_2c * 0x30 + 8)), iVar1 != 0)) &&
          ((*(int *)(in_RCX + 4) == 0 ||
           (*(int *)(*(long *)(in_RSI + 0x30) + (long)local_2c * 0x30 + 0x14) == 0)))) &&
         ((*(int *)(in_RCX + 4) != 0 ||
          ((*(int *)(*(long *)(in_RSI + 0x30) + (long)local_2c * 0x30 + 0xc) != 7 ||
           (*(long *)(*(long *)(in_RSI + 0x30) + (long)local_2c * 0x30 + 0x20) !=
            *(long *)(in_RCX + 0x30))))))) {
        return local_2c;
      }
    }
    else if ((*(long *)(*(long *)(in_RSI + 0x30) + (long)local_2c * 0x30) == 0) &&
            (*(int *)(*(long *)(in_RSI + 0x30) + (long)local_2c * 0x30 + 0x14) == 0)) {
      return local_2c;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

static int
check_response_cache(CManager cm, stone_type stone, action_class stage, event_item *event)
{
    int i;
    for (i=0; i < stone->response_cache_count; i++) {
//	CMtrace_out(cm, EVerbose, "Response cache %d reference_format is %p (%s), Type %s, stage is %d, requires_decoded is %d\n", i, 
//		    stone->response_cache[i].reference_format, 
//		    global_name_of_FMFormat(stone->response_cache[i].reference_format), action_str[stone->response_cache[i].action_type],
//		    stone->response_cache[i].stage, stone->response_cache[i].requires_decoded);
	if (stone->response_cache[i].reference_format == event->reference_format) {
	    /* 
	     * if the event is encoded and the action requires decoded data,
	     * this action won't do.  Scan further for decode action or 
	     * generate one with response_determination().
	     */
	    if ((stone->response_cache[i].action_type == Action_NoAction) &&
		(stage != stone->response_cache[i].stage)) {
		/* don't return NoAction unless we're querying this exact stage */
		continue;
	    }
	    if (!compatible_stages(stage, stone->response_cache[i].stage)) {
		continue;
	    }
	    if (event->event_encoded && stone->response_cache[i].requires_decoded) {
		continue;
	    }
	    if (!event->event_encoded &&
	    	(stone->response_cache[i].action_type == Action_Decode) &&
	    	(stone->response_cache[i].o.decode.target_reference_format == event->reference_format)) {
	    	continue;
	    }
	    return i;
	} else if (stone->response_cache[i].reference_format == NULL &&
                   !stone->response_cache[i].requires_decoded) {
            return i;
        }
    }
    return -1;
}